

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.cpp
# Opt level: O2

void close_state(lua_State *L)

{
  global_State *pgVar1;
  char *pcVar2;
  
  pgVar1 = L->l_G;
  luaF_close(L,L->stack);
  luaC_freeall(L);
  luaM_realloc_(L,(L->l_G->strt).hash,(long)(L->l_G->strt).size << 3,0);
  pcVar2 = (char *)luaM_realloc_(L,(pgVar1->buff).buffer,(pgVar1->buff).buffsize,0);
  (pgVar1->buff).buffer = pcVar2;
  (pgVar1->buff).buffsize = 0;
  freestack(L,L);
  (*pgVar1->frealloc)(pgVar1->ud,L,0x268,0);
  return;
}

Assistant:

static void close_state (lua_State *L) {
  global_State *g = G(L);
  luaF_close(L, L->stack);  /* close all upvalues for this thread */
  luaC_freeall(L);  /* collect all objects */
  lua_assert(g->rootgc == obj2gco(L));
  lua_assert(g->strt.nuse == 0);
  luaM_freearray(L, G(L)->strt.hash, G(L)->strt.size, TString *);
  luaZ_freebuffer(L, &g->buff);
  freestack(L, L);
  lua_assert(g->totalbytes == sizeof(LG));
  (*g->frealloc)(g->ud, fromstate(L), state_size(LG), 0);
}